

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

char * mbedtls_ssl_get_ciphersuite_name(int ciphersuite_id)

{
  mbedtls_ssl_ciphersuite_t *cur;
  int iVar1;
  
  cur = ciphersuite_definitions;
  iVar1 = 0xc009;
  do {
    if (iVar1 == ciphersuite_id) goto LAB_00164a64;
    iVar1 = cur[1].id;
    cur = cur + 1;
  } while (iVar1 != 0);
  cur = (mbedtls_ssl_ciphersuite_t *)0x0;
LAB_00164a64:
  if (cur != (mbedtls_ssl_ciphersuite_t *)0x0) {
    return cur->name;
  }
  return "unknown";
}

Assistant:

const char *mbedtls_ssl_get_ciphersuite_name( const int ciphersuite_id )
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_id( ciphersuite_id );

    if( cur == NULL )
        return( "unknown" );

    return( cur->name );
}